

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGen.c
# Opt level: O0

int Gia_ManSimulateWordsInit(Gia_Man_t *p,Vec_Wrd_t *vSimsIn)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Wrd_t *pVVar4;
  Gia_Obj_t *pObj_00;
  word *__dest;
  word *__src;
  bool bVar5;
  int local_28;
  int nWords;
  int Id;
  int i;
  Gia_Obj_t *pObj;
  Vec_Wrd_t *vSimsIn_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_WrdSize(vSimsIn);
  iVar2 = Gia_ManCiNum(p);
  iVar1 = iVar1 / iVar2;
  iVar2 = Vec_WrdSize(vSimsIn);
  iVar3 = Gia_ManCiNum(p);
  if (iVar2 != iVar1 * iVar3) {
    __assert_fail("Vec_WrdSize(vSimsIn) == nWords * Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGen.c"
                  ,0x75,"int Gia_ManSimulateWordsInit(Gia_Man_t *, Vec_Wrd_t *)");
  }
  Vec_WrdFreeP(&p->vSims);
  iVar2 = Gia_ManObjNum(p);
  pVVar4 = Vec_WrdStart(iVar2 * iVar1);
  p->vSims = pVVar4;
  p->nSimWords = iVar1;
  nWords = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->vCis);
    bVar5 = false;
    if (nWords < iVar2) {
      pObj_00 = Gia_ManCi(p,nWords);
      local_28 = Gia_ObjId(p,pObj_00);
      bVar5 = local_28 != 0;
    }
    if (!bVar5) break;
    __dest = Vec_WrdEntryP(p->vSims,local_28 * iVar1);
    __src = Vec_WrdEntryP(vSimsIn,nWords * iVar1);
    memcpy(__dest,__src,(long)iVar1 << 3);
    nWords = nWords + 1;
  }
  nWords = 1;
  while( true ) {
    bVar5 = false;
    if (nWords < p->nObjs) {
      _Id = Gia_ManObj(p,nWords);
      bVar5 = _Id != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar2 = Gia_ObjIsAnd(_Id);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjIsCi(_Id);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjIsCo(_Id);
        if (iVar2 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGen.c"
                        ,0x86,"int Gia_ManSimulateWordsInit(Gia_Man_t *, Vec_Wrd_t *)");
        }
        Gia_ManObjSimPo(p,nWords);
      }
    }
    else {
      Gia_ManObjSimAnd(p,nWords);
    }
    nWords = nWords + 1;
  }
  return 1;
}

Assistant:

int Gia_ManSimulateWordsInit( Gia_Man_t * p, Vec_Wrd_t * vSimsIn )
{
    Gia_Obj_t * pObj; int i, Id;
    int nWords = Vec_WrdSize(vSimsIn) / Gia_ManCiNum(p);
    assert( Vec_WrdSize(vSimsIn) == nWords * Gia_ManCiNum(p) );
    // allocate simulation info for one timeframe
    Vec_WrdFreeP( &p->vSims );
    p->vSims = Vec_WrdStart( Gia_ManObjNum(p) * nWords );
    p->nSimWords = nWords;
    // set input sim info
    Gia_ManForEachCiId( p, Id, i )
        memcpy( Vec_WrdEntryP(p->vSims, Id*nWords), Vec_WrdEntryP(vSimsIn, i*nWords), sizeof(word)*nWords );
    // perform simulation
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Gia_ManObjSimAnd( p, i );
        else if ( Gia_ObjIsCi(pObj) )
            continue;
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ManObjSimPo( p, i );
        else assert( 0 );
    }
    return 1;
}